

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_test.cpp
# Opt level: O0

void record_render_passes(StateRecorder *recorder)

{
  bool bVar1;
  VkRenderPass_T *pVVar2;
  undefined4 local_278;
  undefined4 local_274;
  VkSampleLocationEXT sample_locs [3];
  undefined4 local_258 [2];
  VkSampleLocationsInfoEXT loc_info;
  VkRenderPassFragmentDensityMapCreateInfoEXT density_map;
  VkInputAttachmentAspectReference aspects [1];
  VkRenderPassInputAttachmentAspectCreateInfo input_att_aspect;
  VkRenderPassMultiviewCreateInfo blank_multiview;
  VkRenderPassMultiviewCreateInfo multiview;
  VkAttachmentDescription att [2];
  undefined1 local_118 [4];
  undefined4 local_114;
  VkSubpassDescription subpasses [2];
  VkSubpassDependency deps [2];
  VkRenderPassCreateInfo pass;
  StateRecorder *recorder_local;
  
  memset(&deps[1].dstAccessMask,0,0x40);
  deps[1].dstAccessMask = 0x26;
  memset(&subpasses[1].pPreserveAttachments,0,0x38);
  memset(local_118,0,0x90);
  memset(&multiview.pCorrelationMasks,0,0x48);
  deps[0].srcAccessMask = 1;
  deps[0].dstStageMask = 0x31;
  deps[0].srcStageMask = 0x22;
  deps[0].dstSubpass = 199;
  deps[0].srcSubpass = 10;
  subpasses[1].pPreserveAttachments._0_4_ = 9;
  subpasses[1].pPreserveAttachments._4_4_ = 0x13;
  deps[1].srcAccessMask = 0x13;
  deps[1].dstStageMask = 0x1ea;
  deps[1].srcStageMask = 0x154;
  deps[1].dstSubpass = 0x7c6;
  deps[1].srcSubpass = 100;
  deps[0].dstAccessMask = 0x5a;
  deps[0].dependencyFlags = 0xbe;
  multiview.pCorrelationMasks._0_4_ = 0x28;
  multiview.pCorrelationMasks._4_4_ = 0x53;
  subpasses[0].pDepthStencilAttachment._0_4_ = 4;
  subpasses[0]._56_8_ = record_render_passes::preserves;
  subpasses[0].flags = 2;
  subpasses[0]._8_8_ = record_render_passes::inputs;
  subpasses[0].pInputAttachments._0_4_ = 2;
  subpasses[0]._24_8_ = record_render_passes::colors;
  local_114 = 1;
  subpasses[0].pResolveAttachments = &record_render_passes::ds;
  subpasses[0].pColorAttachments = record_render_passes::resolves;
  subpasses[1].flags = 1;
  subpasses[1]._8_8_ = record_render_passes::inputs;
  subpasses[1].pInputAttachments._0_4_ = 2;
  subpasses[1]._24_8_ = record_render_passes::colors;
  subpasses[0].pPreserveAttachments._4_4_ = 0;
  memset(&blank_multiview.pCorrelationMasks,0,0x40);
  blank_multiview.pCorrelationMasks._0_4_ = 0x3b9b9908;
  multiview.pNext._0_4_ = 3;
  multiview._16_8_ = record_render_passes::view_masks;
  multiview.pViewMasks._0_4_ = 2;
  multiview._32_8_ = record_render_passes::view_offsets;
  multiview.pViewOffsets._0_4_ = 4;
  multiview._48_8_ = record_render_passes::correlation_masks;
  pVVar2 = fake_handle<VkRenderPass_T*>(30000);
  bVar1 = Fossilize::StateRecorder::record_render_pass
                    (recorder,pVVar2,(VkRenderPassCreateInfo *)&deps[1].dstAccessMask,0);
  if (!bVar1) {
    abort();
  }
  memset(&input_att_aspect.pAspectReferences,0,0x40);
  input_att_aspect.pAspectReferences._0_4_ = 0x3b9b9908;
  pVVar2 = fake_handle<VkRenderPass_T*>(0x7531);
  bVar1 = Fossilize::StateRecorder::record_render_pass
                    (recorder,pVVar2,(VkRenderPassCreateInfo *)&deps[1].dstAccessMask,0);
  if (!bVar1) {
    abort();
  }
  aspects[0].inputAttachmentIndex = 0x3b9c9309;
  aspects[0].aspectMask = 0;
  input_att_aspect.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  input_att_aspect._4_4_ = 0;
  input_att_aspect.pNext = (void *)0x0;
  input_att_aspect.aspectReferenceCount = 0;
  input_att_aspect._20_4_ = 0;
  memset(&density_map.fragmentDensityMapAttachment.layout,0,0xc);
  density_map.fragmentDensityMapAttachment.layout = VK_IMAGE_LAYOUT_UNDEFINED;
  aspects[0].subpass = 1;
  input_att_aspect.pNext = (void *)CONCAT44(input_att_aspect.pNext._4_4_,1);
  input_att_aspect._16_8_ = &density_map.fragmentDensityMapAttachment.layout;
  blank_multiview._0_8_ = &aspects[0].inputAttachmentIndex;
  pVVar2 = fake_handle<VkRenderPass_T*>(0x7532);
  bVar1 = Fossilize::StateRecorder::record_render_pass
                    (recorder,pVVar2,(VkRenderPassCreateInfo *)&deps[1].dstAccessMask,0);
  if (!bVar1) {
    abort();
  }
  loc_info.pSampleLocations = (VkSampleLocationEXT *)0x3b9e1d92;
  density_map.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  density_map._4_4_ = 0;
  density_map.pNext = (void *)0x3b9e1d9000000005;
  pVVar2 = fake_handle<VkRenderPass_T*>(0x7533);
  bVar1 = Fossilize::StateRecorder::record_render_pass
                    (recorder,pVVar2,(VkRenderPassCreateInfo *)&deps[1].dstAccessMask,0);
  if (!bVar1) {
    abort();
  }
  memset(local_258,0,0x28);
  local_258[0] = 0x3b9cf898;
  loc_info.pNext._4_4_ = 9;
  loc_info.sampleLocationsPerPixel =
       VK_SAMPLE_COUNT_8_BIT|VK_SAMPLE_COUNT_4_BIT|VK_SAMPLE_COUNT_2_BIT;
  loc_info.pNext._0_4_ = 2;
  loc_info.sampleLocationGridSize.width = 3;
  loc_info._24_8_ = &local_278;
  local_278 = 0x3e4ccccd;
  local_274 = 0x3e99999a;
  sample_locs[0].x = 0.4;
  sample_locs[0].y = 0.2;
  sample_locs[1].x = 0.8;
  sample_locs[1].y = 0.1;
  pVVar2 = fake_handle<VkRenderPass_T*>(0x7534);
  bVar1 = Fossilize::StateRecorder::record_render_pass
                    (recorder,pVVar2,(VkRenderPassCreateInfo *)&deps[1].dstAccessMask,0);
  if (!bVar1) {
    abort();
  }
  return;
}

Assistant:

static void record_render_passes(StateRecorder &recorder)
{
	VkRenderPassCreateInfo pass = { VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO };
	VkSubpassDependency deps[2] = {};
	VkSubpassDescription subpasses[2] = {};
	VkAttachmentDescription att[2] = {};

	pass.flags = 8;

	deps[0].dependencyFlags = VK_DEPENDENCY_BY_REGION_BIT;
	deps[0].dstAccessMask = 49;
	deps[0].srcAccessMask = 34;
	deps[0].dstStageMask = 199;
	deps[0].srcStageMask = 10;
	deps[0].srcSubpass = 9;
	deps[0].dstSubpass = 19;
	deps[1].dependencyFlags = 19;
	deps[1].dstAccessMask = 490;
	deps[1].srcAccessMask = 340;
	deps[1].dstStageMask = 1990;
	deps[1].srcStageMask = 100;
	deps[1].srcSubpass = 90;
	deps[1].dstSubpass = 190;

	att[0].flags = 40;
	att[0].format = VK_FORMAT_R16G16_SFLOAT;
	att[0].finalLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
	att[0].initialLayout = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
	att[0].loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
	att[0].storeOp = VK_ATTACHMENT_STORE_OP_STORE;
	att[0].stencilLoadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
	att[0].stencilStoreOp = VK_ATTACHMENT_STORE_OP_STORE;
	att[0].samples = VK_SAMPLE_COUNT_16_BIT;

	static const uint32_t preserves[4] = { 9, 4, 2, 3 };
	static const VkAttachmentReference inputs[2] = { { 3, VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL }, { 9, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL } };
	static const VkAttachmentReference colors[2] = { { 8, VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL }, { 1, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL } };
	static const VkAttachmentReference resolves[2] = { { 1, VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL }, { 3, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL } };
	static const VkAttachmentReference ds = { 0, VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL };
	subpasses[0].preserveAttachmentCount = 4;
	subpasses[0].pPreserveAttachments = preserves;
	subpasses[0].inputAttachmentCount = 2;
	subpasses[0].pInputAttachments = inputs;
	subpasses[0].colorAttachmentCount = 2;
	subpasses[0].pColorAttachments = colors;
	subpasses[0].pipelineBindPoint = VK_PIPELINE_BIND_POINT_COMPUTE;
	subpasses[0].pDepthStencilAttachment = &ds;
	subpasses[0].pResolveAttachments = resolves;

	subpasses[1].inputAttachmentCount = 1;
	subpasses[1].pInputAttachments = inputs;
	subpasses[1].colorAttachmentCount = 2;
	subpasses[1].pColorAttachments = colors;
	subpasses[1].pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;

	pass.attachmentCount = 2;
	pass.pAttachments = att;
	pass.subpassCount = 2;
	pass.pSubpasses = subpasses;
	pass.dependencyCount = 0;
	pass.pDependencies = deps;

	VkRenderPassMultiviewCreateInfo multiview = { VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO };
	multiview.subpassCount = 3;
	static const uint32_t view_masks[3] = { 2, 4, 5 };
	multiview.pViewMasks = view_masks;
	multiview.dependencyCount = 2;
	static const int32_t view_offsets[2] = { -2, 1 };
	multiview.pViewOffsets = view_offsets;
	multiview.correlationMaskCount = 4;
	static const uint32_t correlation_masks[4] = { 1, 2, 3, 4 };
	multiview.pCorrelationMasks = correlation_masks;
	pass.pNext = &multiview;

	if (!recorder.record_render_pass(fake_handle<VkRenderPass>(30000), pass))
		abort();

	pass.dependencyCount = 0;
	VkRenderPassMultiviewCreateInfo blank_multiview = { VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO };
	pass.pNext = &blank_multiview;
	if (!recorder.record_render_pass(fake_handle<VkRenderPass>(30001), pass))
		abort();

	VkRenderPassInputAttachmentAspectCreateInfo input_att_aspect = { VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO };
	VkInputAttachmentAspectReference aspects[1] = { };
	aspects[0].subpass = 0;
	aspects[0].inputAttachmentIndex = 0;
	aspects[0].aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
	input_att_aspect.aspectReferenceCount = 1;
	input_att_aspect.pAspectReferences = aspects;
	blank_multiview.pNext = &input_att_aspect;

	if (!recorder.record_render_pass(fake_handle<VkRenderPass>(30002), pass))
		abort();

	VkRenderPassFragmentDensityMapCreateInfoEXT density_map =
			{ VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT };
	density_map.fragmentDensityMapAttachment.attachment = 5;
	density_map.fragmentDensityMapAttachment.layout = VK_IMAGE_LAYOUT_FRAGMENT_DENSITY_MAP_OPTIMAL_EXT;
	pass.pNext = &density_map;
	if (!recorder.record_render_pass(fake_handle<VkRenderPass>(30003), pass))
		abort();

	VkSampleLocationsInfoEXT loc_info =
			{ VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT };
	loc_info.sampleLocationGridSize.width = 9;
	loc_info.sampleLocationGridSize.height = 14;
	loc_info.sampleLocationsPerPixel = VK_SAMPLE_COUNT_2_BIT;
	loc_info.sampleLocationsCount = 3;
	VkSampleLocationEXT sample_locs[3];
	loc_info.pSampleLocations = sample_locs;
	sample_locs[0].x = 0.2f;
	sample_locs[0].y = 0.3f;
	sample_locs[1].x = 0.4f;
	sample_locs[1].y = 0.2f;
	sample_locs[2].x = 0.8f;
	sample_locs[2].y = 0.1f;
	pass.pNext = &loc_info;
	if (!recorder.record_render_pass(fake_handle<VkRenderPass>(30004), pass))
		abort();
}